

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canfdtest.c
# Opt level: O0

void print_frame(canid_t id,uint8_t *data,int dlc,int inc_data)

{
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  uint in_EDI;
  int i;
  int local_1c;
  
  printf("%04x: ",(ulong)in_EDI);
  if ((in_EDI & 0x40000000) == 0) {
    printf("[%d]",(ulong)in_EDX);
    for (local_1c = 0; local_1c < (int)in_EDX; local_1c = local_1c + 1) {
      printf(" %02x",(ulong)((uint)*(byte *)(in_RSI + local_1c) + in_ECX & 0xff));
    }
  }
  else {
    printf("remote request");
  }
  printf("\n");
  return;
}

Assistant:

static void print_frame(canid_t id, const uint8_t *data, int dlc, int inc_data)
{
	int i;

	printf("%04x: ", id);
	if (id & CAN_RTR_FLAG) {
		printf("remote request");
	} else {
		printf("[%d]", dlc);
		for (i = 0; i < dlc; i++)
			printf(" %02x", (uint8_t)(data[i] + inc_data));
	}
	printf("\n");
}